

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_blend_popcnt_unroll4(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar13 [16];
  int j;
  int i_2;
  __m256i input1_1;
  __m256i input0_1;
  __m256i v1_1;
  __m256i v0_1;
  int i_1;
  __m256i input3;
  __m256i input2;
  __m256i input1;
  __m256i input0;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  size_t i;
  uint32_t n_cycles;
  __m256i *data_vectors;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined4 local_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined8 local_920;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  
  for (local_920 = 0; local_920 + 4 <= (ulong)(in_ESI >> 4); local_920 = local_920 + 4) {
    pauVar11 = (undefined1 (*) [32])(in_RDI + local_920 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_920 * 0x20);
    pauVar12 = (undefined1 (*) [32])(in_RDI + 0x40 + local_920 * 0x20);
    pauVar2 = (undefined1 (*) [32])(in_RDI + 0x60 + local_920 * 0x20);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    auVar4 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar4 = vpinsrw_avx(auVar4,0xff,2);
    auVar4 = vpinsrw_avx(auVar4,0xff,3);
    auVar4 = vpinsrw_avx(auVar4,0xff,4);
    auVar4 = vpinsrw_avx(auVar4,0xff,5);
    auVar4 = vpinsrw_avx(auVar4,0xff,6);
    auVar4 = vpinsrw_avx(auVar4,0xff,7);
    uStack_410 = auVar4._0_8_;
    uStack_408 = auVar4._8_8_;
    auVar10._16_8_ = uStack_410;
    auVar10._0_16_ = auVar3;
    auVar10._24_8_ = uStack_408;
    auVar5 = vpand_avx2(*pauVar11,auVar10);
    auVar6 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_9c0 = vpor_avx2(auVar5,auVar6);
    auVar3 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar3 = vpinsrw_avx(auVar3,0xff00,2);
    auVar3 = vpinsrw_avx(auVar3,0xff00,3);
    auVar3 = vpinsrw_avx(auVar3,0xff00,4);
    auVar3 = vpinsrw_avx(auVar3,0xff00,5);
    auVar3 = vpinsrw_avx(auVar3,0xff00,6);
    auVar3 = vpinsrw_avx(auVar3,0xff00,7);
    auVar4 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar4 = vpinsrw_avx(auVar4,0xff00,2);
    auVar4 = vpinsrw_avx(auVar4,0xff00,3);
    auVar4 = vpinsrw_avx(auVar4,0xff00,4);
    auVar4 = vpinsrw_avx(auVar4,0xff00,5);
    auVar4 = vpinsrw_avx(auVar4,0xff00,6);
    auVar4 = vpinsrw_avx(auVar4,0xff00,7);
    uStack_3d0 = auVar4._0_8_;
    uStack_3c8 = auVar4._8_8_;
    auVar9._16_8_ = uStack_3d0;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = uStack_3c8;
    auVar5 = vpand_avx2(*pauVar11,auVar9);
    auVar6 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_9e0 = vpor_avx2(auVar5,auVar6);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    auVar4 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar4 = vpinsrw_avx(auVar4,0xff,2);
    auVar4 = vpinsrw_avx(auVar4,0xff,3);
    auVar4 = vpinsrw_avx(auVar4,0xff,4);
    auVar4 = vpinsrw_avx(auVar4,0xff,5);
    auVar4 = vpinsrw_avx(auVar4,0xff,6);
    auVar4 = vpinsrw_avx(auVar4,0xff,7);
    uStack_390 = auVar4._0_8_;
    uStack_388 = auVar4._8_8_;
    auVar6._16_8_ = uStack_390;
    auVar6._0_16_ = auVar3;
    auVar6._24_8_ = uStack_388;
    auVar5 = vpand_avx2(*pauVar12,auVar6);
    auVar6 = vpsllw_avx2(*pauVar2,ZEXT416(8));
    local_a00 = vpor_avx2(auVar5,auVar6);
    auVar3 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar3 = vpinsrw_avx(auVar3,0xff00,2);
    auVar3 = vpinsrw_avx(auVar3,0xff00,3);
    auVar3 = vpinsrw_avx(auVar3,0xff00,4);
    auVar3 = vpinsrw_avx(auVar3,0xff00,5);
    auVar3 = vpinsrw_avx(auVar3,0xff00,6);
    auVar3 = vpinsrw_avx(auVar3,0xff00,7);
    auVar4 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar4 = vpinsrw_avx(auVar4,0xff00,2);
    auVar4 = vpinsrw_avx(auVar4,0xff00,3);
    auVar4 = vpinsrw_avx(auVar4,0xff00,4);
    auVar4 = vpinsrw_avx(auVar4,0xff00,5);
    auVar4 = vpinsrw_avx(auVar4,0xff00,6);
    auVar4 = vpinsrw_avx(auVar4,0xff00,7);
    auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    uStack_350 = auVar13._0_8_;
    uStack_348 = auVar13._8_8_;
    auVar5._16_8_ = uStack_350;
    auVar5._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
    auVar5._24_8_ = uStack_348;
    auVar5 = vpand_avx2(*pauVar12,auVar5);
    auVar6 = vpsrlw_avx2(*pauVar2,ZEXT416(8));
    local_a20 = vpor_avx2(auVar5,auVar6);
    for (local_a24 = 0; local_a24 < 8; local_a24 = local_a24 + 1) {
      *(int *)(in_RDX + (long)(7 - local_a24) * 4) =
           POPCOUNT((uint)(SUB321(local_9c0 >> 7,0) & 1) |
                    (uint)(SUB321(local_9c0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_9c0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_9c0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_9c0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_9c0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_9c0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_9c0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_9c0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_9c0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_9c0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_9c0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_9c0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_9c0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_9c0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_9c0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_9c0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_9c0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_9c0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_9c0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_9c0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_9c0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_9c0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_9c0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_9c0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_9c0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_9c0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_9c0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_9c0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_9c0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_9c0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_9c0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_a24) * 4);
      *(int *)(in_RDX + (long)(0xf - local_a24) * 4) =
           POPCOUNT((uint)(SUB321(local_9e0 >> 7,0) & 1) |
                    (uint)(SUB321(local_9e0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_9e0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_9e0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_9e0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_9e0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_9e0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_9e0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_9e0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_9e0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_9e0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_9e0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_9e0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_9e0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_9e0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_9e0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_9e0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_9e0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_9e0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_9e0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_9e0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_9e0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_9e0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_9e0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_9e0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_9e0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_9e0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_9e0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_9e0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_9e0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_9e0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_9e0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_a24) * 4);
      *(int *)(in_RDX + (long)(7 - local_a24) * 4) =
           POPCOUNT((uint)(SUB321(local_a00 >> 7,0) & 1) |
                    (uint)(SUB321(local_a00 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_a00 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_a00 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_a00 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_a00 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_a00 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_a00 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_a00 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_a00 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_a00 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_a00 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_a00 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_a00 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_a00 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_a00 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_a00 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_a00 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_a00 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_a00 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_a00 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_a00 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_a00 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_a00 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_a00 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_a00 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_a00 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_a00 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_a00 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_a00 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_a00 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_a00[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_a24) * 4);
      *(int *)(in_RDX + (long)(0xf - local_a24) * 4) =
           POPCOUNT((uint)(SUB321(local_a20 >> 7,0) & 1) |
                    (uint)(SUB321(local_a20 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_a20 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_a20 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_a20 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_a20 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_a20 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_a20 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_a20 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_a20 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_a20 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_a20 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_a20 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_a20 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_a20 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_a20 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_a20 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_a20 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_a20 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_a20 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_a20 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_a20 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_a20 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_a20 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_a20 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_a20 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_a20 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_a20 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_a20 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_a20 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_a20 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_a20[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_a24) * 4);
      local_9c0 = vpaddb_avx2(local_9c0,local_9c0);
      local_9e0 = vpaddb_avx2(local_9e0,local_9e0);
      local_a00 = vpaddb_avx2(local_a00,local_a00);
      local_a20 = vpaddb_avx2(local_a20,local_a20);
    }
  }
  for (; local_920 + 2 <= (ulong)(in_ESI >> 4); local_920 = local_920 + 2) {
    pauVar12 = (undefined1 (*) [32])(in_RDI + local_920 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_920 * 0x20);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    auVar4 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar4 = vpinsrw_avx(auVar4,0xff,2);
    auVar4 = vpinsrw_avx(auVar4,0xff,3);
    auVar4 = vpinsrw_avx(auVar4,0xff,4);
    auVar4 = vpinsrw_avx(auVar4,0xff,5);
    auVar4 = vpinsrw_avx(auVar4,0xff,6);
    auVar4 = vpinsrw_avx(auVar4,0xff,7);
    uStack_310 = auVar4._0_8_;
    uStack_308 = auVar4._8_8_;
    auVar8._16_8_ = uStack_310;
    auVar8._0_16_ = auVar3;
    auVar8._24_8_ = uStack_308;
    auVar5 = vpand_avx2(*pauVar12,auVar8);
    auVar6 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_aa0 = vpor_avx2(auVar5,auVar6);
    auVar3 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar3 = vpinsrw_avx(auVar3,0xff00,2);
    auVar3 = vpinsrw_avx(auVar3,0xff00,3);
    auVar3 = vpinsrw_avx(auVar3,0xff00,4);
    auVar3 = vpinsrw_avx(auVar3,0xff00,5);
    auVar3 = vpinsrw_avx(auVar3,0xff00,6);
    auVar3 = vpinsrw_avx(auVar3,0xff00,7);
    auVar4 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar4 = vpinsrw_avx(auVar4,0xff00,2);
    auVar4 = vpinsrw_avx(auVar4,0xff00,3);
    auVar4 = vpinsrw_avx(auVar4,0xff00,4);
    auVar4 = vpinsrw_avx(auVar4,0xff00,5);
    auVar4 = vpinsrw_avx(auVar4,0xff00,6);
    auVar4 = vpinsrw_avx(auVar4,0xff00,7);
    auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    uStack_2d0 = auVar13._0_8_;
    uStack_2c8 = auVar13._8_8_;
    auVar7._16_8_ = uStack_2d0;
    auVar7._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
    auVar7._24_8_ = uStack_2c8;
    auVar5 = vpand_avx2(*pauVar12,auVar7);
    auVar6 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_ac0 = vpor_avx2(auVar5,auVar6);
    for (local_ac4 = 0; local_ac4 < 8; local_ac4 = local_ac4 + 1) {
      *(int *)(in_RDX + (long)(7 - local_ac4) * 4) =
           POPCOUNT((uint)(SUB321(local_aa0 >> 7,0) & 1) |
                    (uint)(SUB321(local_aa0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_aa0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_aa0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_aa0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_aa0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_aa0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_aa0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_aa0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_aa0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_aa0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_aa0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_aa0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_aa0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_aa0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_aa0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_aa0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_aa0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_aa0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_aa0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_aa0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_aa0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_aa0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_aa0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_aa0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_aa0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_aa0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_aa0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_aa0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_aa0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_aa0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_aa0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_ac4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_ac4) * 4) =
           POPCOUNT((uint)(SUB321(local_ac0 >> 7,0) & 1) |
                    (uint)(SUB321(local_ac0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_ac0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_ac0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_ac0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_ac0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_ac0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_ac0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_ac0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_ac0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_ac0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_ac0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_ac0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_ac0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_ac0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_ac0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_ac0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_ac0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_ac0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_ac0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_ac0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_ac0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_ac0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_ac0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_ac0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_ac0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_ac0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_ac0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_ac0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_ac0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_ac0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_ac0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_ac4) * 4);
      local_aa0 = vpaddb_avx2(local_aa0,local_aa0);
      local_ac0 = vpaddb_avx2(local_ac0,local_ac0);
    }
  }
  for (local_920 = local_920 << 4; local_920 < in_ESI; local_920 = local_920 + 1) {
    for (local_ac8 = 0; local_ac8 < 0x10; local_ac8 = local_ac8 + 1) {
      *(int *)(in_RDX + (long)local_ac8 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_920 * 2) & 1 << ((byte)local_ac8 & 0x1f)) >>
           ((byte)local_ac8 & 0x1f)) + *(int *)(in_RDX + (long)local_ac8 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll4(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        
#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
       U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}